

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4f6b0e::Handlers::pushKey(Handlers *this,string *key)

{
  JSONHandler *this_00;
  shared_ptr<JSONHandler> new_jh;
  undefined1 local_39;
  shared_ptr<JSONHandler> local_38;
  shared_ptr<JSONHandler> local_28;
  
  local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (JSONHandler **)&local_28,(allocator<JSONHandler> *)&local_39);
  this_00 = this->jh;
  local_38.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(this_00,key,&local_38);
  if (local_38.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this->jh = local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,&local_28);
  if (local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void
Handlers::pushKey(std::string const& key)
{
    auto new_jh = std::make_shared<JSONHandler>();
    this->jh->addDictKeyHandler(key, new_jh);
    this->jh = new_jh.get();
    this->json_handlers.emplace_back(std::move(new_jh));
}